

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  NamedLabelSyntax *args;
  CheckerInstantiationSyntax *node;
  CheckerInstanceStatementSyntax *pCVar1;
  BumpAllocator *in_stack_00000078;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000080;
  CheckerInstantiationSyntax *in_stack_ffffffffffffffc8;
  NamedLabelSyntax *in_stack_ffffffffffffffd0;
  
  if (*(long *)(__fn + 0x18) == 0) {
    args = (NamedLabelSyntax *)0x0;
  }
  else {
    args = deepClone<slang::syntax::NamedLabelSyntax>
                     (in_stack_ffffffffffffffd0,(BumpAllocator *)in_stack_ffffffffffffffc8);
  }
  node = (CheckerInstantiationSyntax *)
         deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000080,in_stack_00000078);
  not_null<slang::syntax::CheckerInstantiationSyntax_*>::operator*
            ((not_null<slang::syntax::CheckerInstantiationSyntax_*> *)0x7982d7);
  deepClone<slang::syntax::CheckerInstantiationSyntax>
            (node,(BumpAllocator *)in_stack_ffffffffffffffc8);
  pCVar1 = BumpAllocator::
           emplace<slang::syntax::CheckerInstanceStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::syntax::CheckerInstantiationSyntax&>
                     ((BumpAllocator *)__child_stack,(NamedLabelSyntax **)args,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)node,
                      in_stack_ffffffffffffffc8);
  return (int)pCVar1;
}

Assistant:

static SyntaxNode* clone(const CheckerInstanceStatementSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<CheckerInstanceStatementSyntax>(
        node.label ? deepClone(*node.label, alloc) : nullptr,
        *deepClone(node.attributes, alloc),
        *deepClone<CheckerInstantiationSyntax>(*node.instance, alloc)
    );
}